

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void kratos::InsertVerilatorPublic::insert_str(Var *var)

{
  string local_40 [39];
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>(local_40," /*verilator public*/",&local_19);
  std::__cxx11::string::_M_assign((string *)&var->after_var_str_);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void static insert_str(Var *var) { var->set_after_var_str_(" /*verilator public*/"); }